

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_CheckMove(AActor *thing,DVector2 *pos,int flags)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  bool local_1ab;
  TFlags<ActorFlag2,_unsigned_int> local_128;
  undefined1 local_124 [4];
  TFlags<ActorFlag,_unsigned_int> local_120;
  byte local_119;
  double dStack_118;
  bool good;
  double savedz;
  TFlags<ActorFlag,_unsigned_int> local_108;
  TFlags<ActorFlag3,_unsigned_int> local_104;
  TFlags<ActorFlag,_unsigned_int> local_100;
  TFlags<ActorFlag,_unsigned_int> local_fc;
  TFlags<ActorFlag2,_unsigned_int> local_f8;
  TFlags<ActorFlag,_unsigned_int> local_f4;
  TFlags<ActorFlag2,_unsigned_int> local_f0;
  TFlags<ActorFlag3,_unsigned_int> local_ec;
  TFlags<ActorFlag,_unsigned_int> local_e8;
  TFlags<ActorFlag,_unsigned_int> local_e4;
  TFlags<ActorFlag3,_unsigned_int> local_e0;
  TFlags<ActorFlag3,_unsigned_int> local_dc;
  undefined4 local_d8;
  sector_t *local_c8;
  double newz;
  FCheckPosition tm;
  int flags_local;
  DVector2 *pos_local;
  AActor *thing_local;
  
  tm.PushTime = flags;
  FCheckPosition::FCheckPosition((FCheckPosition *)&newz,false);
  local_c8 = (sector_t *)AActor::Z(thing);
  bVar2 = P_CheckPosition(thing,pos,(FCheckPosition *)&newz,false);
  if (!bVar2) {
    if ((tm.PushTime == 0) || (((tm.PushTime & 2U) == 0 && ((tm.PushTime & 4U) == 0)))) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
    if (((tm.PushTime & 2U) == 0) && (thing->BlockingMobj != (AActor *)0x0)) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
    if (((tm.PushTime & 4U) == 0) && (thing->BlockingLine != (line_t *)0x0)) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
  }
  iVar1 = (int)thing;
  TFlags<ActorFlag3,_unsigned_int>::operator&
            (&local_dc,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_dc);
  if (uVar3 == 0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_e0,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
    if (uVar3 != 0) {
      local_c8 = (sector_t *)(tm.floorz - thing->Height);
    }
  }
  else {
    local_c8 = tm.sector;
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_e4,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
  if (uVar3 == 0) {
    if (tm.floorz - (double)tm.sector < thing->Height) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_e8,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e8);
    bVar2 = false;
    if ((uVar3 == 0) && (bVar2 = false, tm.floorz - (double)local_c8 < thing->Height)) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_ec,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG)
                );
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
      bVar2 = false;
      if (uVar3 == 0) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_f0,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f0);
        bVar2 = true;
        if (uVar3 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_f4,
                     iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                             MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f4);
          bVar2 = uVar3 == 0;
        }
      }
    }
    if (bVar2) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_f8,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f8);
    bVar2 = false;
    if (uVar3 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_fc,
                 iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
      bVar2 = uVar3 != 0;
    }
    if ((bVar2) && (dVar4 = AActor::Top(thing), tm.floorz < dVar4)) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_100,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_100);
    bVar2 = false;
    if (uVar3 == 0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_104,
                 iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
      bVar2 = uVar3 == 0;
    }
    if (bVar2) {
      if (thing->MaxStepHeight <= (double)tm.sector - (double)local_c8 &&
          (double)tm.sector - (double)local_c8 != thing->MaxStepHeight) {
        thing_local._7_1_ = false;
        goto LAB_00585a00;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_108,
                 iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_108);
      bVar2 = false;
      if (uVar3 != 0) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  ((TFlags<ActorFlag6,_unsigned_int> *)((long)&savedz + 4),
                   iVar1 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&savedz + 4));
        bVar2 = false;
        if (uVar3 == 0) {
          bVar2 = (double)local_c8 < (double)tm.sector;
        }
      }
      if (bVar2) {
        thing_local._7_1_ = false;
        goto LAB_00585a00;
      }
      if ((double)tm.sector <= (double)local_c8) {
        bVar2 = false;
        if ((tm.PushTime & 1U) != 0) {
          operator|((EnumType)local_124,MF_FLOAT);
          TFlags<ActorFlag,_unsigned_int>::operator&(&local_120,&thing->flags);
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_120);
          bVar2 = uVar3 == 0;
        }
        if ((bVar2) &&
           (thing->MaxDropOffHeight <= (double)local_c8 - tm.ceilingz &&
            (double)local_c8 - tm.ceilingz != thing->MaxDropOffHeight)) {
          thing_local._7_1_ = false;
          goto LAB_00585a00;
        }
      }
      else {
        dStack_118 = AActor::Z(thing);
        local_c8 = tm.sector;
        AActor::SetZ(thing,(double)tm.sector,true);
        local_119 = P_TestMobjZ(thing,true,(AActor **)0x0);
        AActor::SetZ(thing,dStack_118,true);
        if ((local_119 & 1) == 0) {
          thing_local._7_1_ = false;
          goto LAB_00585a00;
        }
      }
    }
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_128,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_128);
    local_1ab = false;
    if (uVar3 != 0) {
      local_1ab = FTextureID::operator!=((FTextureID *)&tm.dropoffz,&thing->floorpic);
      local_1ab = local_1ab || (double)tm.sector - (double)local_c8 != 0.0;
    }
    if (local_1ab) {
      thing_local._7_1_ = false;
      goto LAB_00585a00;
    }
  }
  thing_local._7_1_ = true;
LAB_00585a00:
  local_d8 = 1;
  FCheckPosition::~FCheckPosition((FCheckPosition *)&newz);
  return thing_local._7_1_;
}

Assistant:

bool P_CheckMove(AActor *thing, const DVector2 &pos, int flags)
{
	FCheckPosition tm;
	double		newz = thing->Z();

	if (!P_CheckPosition(thing, pos, tm))
	{
		// Ignore PCM_DROPOFF. Not necessary here: a little later it is.
		if (!flags || (!(flags & PCM_NOACTORS) && !(flags & PCM_NOLINES)))
		{
			return false;
		}
		if (!(flags & PCM_NOACTORS) && thing->BlockingMobj)
		{
			return false;
		}
		if (!(flags & PCM_NOLINES) && thing->BlockingLine)
		{
			return false;
		}
	}

	if (thing->flags3 & MF3_FLOORHUGGER)
	{
		newz = tm.floorz;
	}
	else if (thing->flags3 & MF3_CEILINGHUGGER)
	{
		newz = tm.ceilingz - thing->Height;
	}

	if (!(thing->flags & MF_NOCLIP))
	{
		if (tm.ceilingz - tm.floorz < thing->Height)
		{
			return false;
		}

		if (!(thing->flags & MF_TELEPORT)
			&& tm.ceilingz - newz < thing->Height
			&& !(thing->flags3 & MF3_CEILINGHUGGER)
			&& (!(thing->flags2 & MF2_FLY) || !(thing->flags & MF_NOGRAVITY)))
		{
			return false;
		}
		if (thing->flags2 & MF2_FLY && thing->flags & MF_NOGRAVITY)
		{
			if (thing->Top() > tm.ceilingz)
				return false;
		}
		if (!(thing->flags & MF_TELEPORT) && !(thing->flags3 & MF3_FLOORHUGGER))
		{
			if (tm.floorz - newz > thing->MaxStepHeight)
			{ // too big a step up
				return false;
			}
			else if ((thing->flags & MF_MISSILE) && !(thing->flags6 & MF6_STEPMISSILE) && tm.floorz > newz)
			{ // [RH] Don't let normal missiles climb steps
				return false;
			}
			else if (newz < tm.floorz)
			{ // [RH] Check to make sure there's nothing in the way for the step up
				double savedz = thing->Z();
				thing->SetZ(newz = tm.floorz);
				bool good = P_TestMobjZ(thing);
				thing->SetZ(savedz);
				if (!good)
				{
					return false;
				}
			}
			else if ((flags & PCM_DROPOFF) && !(thing->flags & (MF_FLOAT|MF_DROPOFF)))
			{
				if (newz - tm.dropoffz > thing->MaxDropOffHeight)
				{
					return false;
				}
			}
		}

		if (thing->flags2 & MF2_CANTLEAVEFLOORPIC
			&& (tm.floorpic != thing->floorpic
			|| tm.floorz - newz != 0))
		{ // must stay within a sector of a certain floor type
			return false;
		}
	}

	return true;
}